

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::fillArea(Player *this)

{
  ostream *poVar1;
  int id;
  uint id_00;
  int length;
  int responseCode;
  string local_50;
  
  UI::clearScreen();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Now fills: ",0xb);
  getName_abi_cxx11_(&local_50,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      (char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                       (int)local_50._M_dataplus._M_p),local_50._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                    local_50.field_2._M_allocated_capacity + 1);
  }
  if (this->role == false) {
    Keyboard::getch();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Computer already placed his ships!",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Press any key to continue... ",0x1d);
  Keyboard::getch();
  local_50._M_dataplus._M_p._0_4_ = 0;
  length = 4;
  id_00 = 0;
  do {
    if ((id_00 < 7) && ((0x4bU >> (id_00 & 0x1f) & 1) != 0)) {
      length = (&DAT_0010628c)[id_00];
    }
    if (this->role == true) {
      local_50._M_dataplus._M_p._0_4_ = 0;
      do {
        placeShipWithResponse(this,length,id_00,(int *)&local_50);
      } while ((int)local_50._M_dataplus._M_p != 10);
    }
    else {
      AI::recommendAndSetShipPlacement(this,length,id_00);
    }
    id_00 = id_00 + 1;
  } while (id_00 != 10);
  return;
}

Assistant:

void Player::fillArea()
{
    UI::clearScreen();
    std::cout << "Now fills: " << getName() << std::endl;

    if (!getRole())
    {
        Keyboard::getch();
        std::cout << "Computer already placed his ships!" << std::endl;
    }
    std::cout << "Press any key to continue... ";
    Keyboard::getch();

    int responseCode = 0;
    int length = 4;

    for(int id = 0; id < 10; id++)
    {
        switch (id)
        {
            case 0: length = 4;
                break;
            case 1:
                length = 3;
                break;

            case 3:
                length = 2;
                break;

            case 6:
                length = 1;
            default:
                break;
        }

        if (getRole()) //if human plays
        {
            responseCode = 0;
            while (responseCode != Player::SUCCEDPLACEMENT_CODE)
            {
                placeShipWithResponse(length, id, responseCode);
            }
        }
        else //if computer
            AI::recommendAndSetShipPlacement(*this, length, id);
    }




//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,1, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(3,2, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,3, responseCode);

//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,4, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(2,5, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,6, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,7, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,8, responseCode);
//
//    responseCode = 0;
//    while (responseCode != Player::SUCCEDPLACEMENT_CODE)
//        placeShipWithResponse(1,9, responseCode);

}